

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Propagator.h
# Opt level: O3

SpanContext * __thiscall
jaegertracing::propagation::BinaryPropagator::extract
          (SpanContext *__return_storage_ptr__,BinaryPropagator *this,istream *in)

{
  uint uVar1;
  _Tuple_impl<0UL,_jaegertracing::metrics::Counter_*,_std::default_delete<jaegertracing::metrics::Counter>_>
  _Var2;
  type_conflict tVar3;
  type_conflict tVar4;
  type tVar5;
  long *plVar6;
  mapped_type *pmVar7;
  char ch;
  string key;
  string value;
  TraceID traceID;
  StrMap baggage;
  key_type local_f8;
  _func_int **local_d8;
  __node_base_ptr *local_d0;
  __node_base *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  size_t *local_b8;
  BinaryPropagator *local_b0;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  type local_88;
  type local_80;
  TraceID local_78;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_b0 = this;
  tVar5 = readBinary<unsigned_long>(in);
  local_78._low = readBinary<unsigned_long>(in);
  local_78._high = tVar5;
  local_80 = readBinary<unsigned_long>(in);
  local_88 = readBinary<unsigned_long>(in);
  std::istream::get((char *)in);
  tVar3 = readBinary<unsigned_int>(in);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::rehash(&local_68,(ulong)tVar3);
  if (tVar3 != 0) {
    local_d0 = &(__return_storage_ptr__->_baggage)._M_h._M_single_bucket;
    local_c8 = &(__return_storage_ptr__->_baggage)._M_h._M_before_begin;
    local_b8 = &(__return_storage_ptr__->_baggage)._M_h._M_rehash_policy._M_next_resize;
    local_c0 = &(__return_storage_ptr__->_debugID).field_2;
    local_d8 = (_func_int **)&PTR__SpanContext_00264a78;
    do {
      tVar4 = readBinary<unsigned_int>(in);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_f8,(char)tVar4);
      plVar6 = (long *)std::istream::read((char *)in,(long)local_f8._M_dataplus._M_p);
      if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) != 0) {
        _Var2.super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>._M_head_impl =
             (((local_b0->_metrics).
               super___shared_ptr<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_decodingErrors)._M_t.
             super___uniq_ptr_impl<jaegertracing::metrics::Counter,_std::default_delete<jaegertracing::metrics::Counter>_>
             ._M_t.
             super__Tuple_impl<0UL,_jaegertracing::metrics::Counter_*,_std::default_delete<jaegertracing::metrics::Counter>_>
             .super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>;
        (**(code **)(*(long *)_Var2.super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>.
                              _M_head_impl + 0x10))
                  (_Var2.super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>.
                   _M_head_impl,1);
        (__return_storage_ptr__->super_SpanContext)._vptr_SpanContext = local_d8;
        __return_storage_ptr__->_flags = '\0';
        __return_storage_ptr__->_spanID = 0;
        __return_storage_ptr__->_parentID = 0;
        (__return_storage_ptr__->_traceID)._high = 0;
        (__return_storage_ptr__->_traceID)._low = 0;
        (__return_storage_ptr__->_baggage)._M_h._M_buckets = local_d0;
        (__return_storage_ptr__->_baggage)._M_h._M_bucket_count = 1;
        local_c8->_M_nxt = (_Hash_node_base *)0x0;
        local_c8[1] = (_Hash_node_base *)0x0;
        (__return_storage_ptr__->_baggage)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        *local_b8 = 0;
        local_b8[1] = 0;
        (__return_storage_ptr__->_debugID)._M_dataplus._M_p = (pointer)local_c0;
        (__return_storage_ptr__->_debugID)._M_string_length = 0;
        (__return_storage_ptr__->_debugID).field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->_mutex).super___mutex_base._M_mutex.__data.__list.__next =
             (__pthread_internal_list *)0x0;
        *(undefined8 *)((long)&(__return_storage_ptr__->_mutex).super___mutex_base._M_mutex + 0x10)
             = 0;
        (__return_storage_ptr__->_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
             (__pthread_internal_list *)0x0;
        (__return_storage_ptr__->_mutex).super___mutex_base._M_mutex.__align = 0;
        *(undefined8 *)((long)&(__return_storage_ptr__->_mutex).super___mutex_base._M_mutex + 8) = 0
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p == &local_f8.field_2) goto LAB_001be9f9;
        goto LAB_001be9f4;
      }
      tVar4 = readBinary<unsigned_int>(in);
      local_a8[0] = local_98;
      std::__cxx11::string::_M_construct((ulong)local_a8,(char)tVar4);
      plVar6 = (long *)std::istream::read((char *)in,(long)local_a8[0]);
      uVar1 = *(uint *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20);
      if ((uVar1 & 5) == 0) {
        pmVar7 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&local_68,&local_f8);
        std::__cxx11::string::_M_assign((string *)pmVar7);
      }
      else {
        _Var2.super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>._M_head_impl =
             (((local_b0->_metrics).
               super___shared_ptr<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_decodingErrors)._M_t.
             super___uniq_ptr_impl<jaegertracing::metrics::Counter,_std::default_delete<jaegertracing::metrics::Counter>_>
             ._M_t.
             super__Tuple_impl<0UL,_jaegertracing::metrics::Counter_*,_std::default_delete<jaegertracing::metrics::Counter>_>
             .super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>;
        (**(code **)(*(long *)_Var2.super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>.
                              _M_head_impl + 0x10))
                  (_Var2.super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>.
                   _M_head_impl,1);
        (__return_storage_ptr__->super_SpanContext)._vptr_SpanContext = local_d8;
        __return_storage_ptr__->_flags = '\0';
        __return_storage_ptr__->_spanID = 0;
        __return_storage_ptr__->_parentID = 0;
        (__return_storage_ptr__->_traceID)._high = 0;
        (__return_storage_ptr__->_traceID)._low = 0;
        (__return_storage_ptr__->_baggage)._M_h._M_buckets = local_d0;
        (__return_storage_ptr__->_baggage)._M_h._M_bucket_count = 1;
        local_c8->_M_nxt = (_Hash_node_base *)0x0;
        local_c8[1] = (_Hash_node_base *)0x0;
        (__return_storage_ptr__->_baggage)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        *local_b8 = 0;
        local_b8[1] = 0;
        (__return_storage_ptr__->_debugID)._M_dataplus._M_p = (pointer)local_c0;
        (__return_storage_ptr__->_debugID)._M_string_length = 0;
        (__return_storage_ptr__->_debugID).field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->_mutex).super___mutex_base._M_mutex.__data.__list.__next =
             (__pthread_internal_list *)0x0;
        *(undefined8 *)((long)&(__return_storage_ptr__->_mutex).super___mutex_base._M_mutex + 0x10)
             = 0;
        (__return_storage_ptr__->_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
             (__pthread_internal_list *)0x0;
        (__return_storage_ptr__->_mutex).super___mutex_base._M_mutex.__align = 0;
        *(undefined8 *)((long)&(__return_storage_ptr__->_mutex).super___mutex_base._M_mutex + 8) = 0
        ;
      }
      if (local_a8[0] != local_98) {
        operator_delete(local_a8[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      if ((uVar1 & 5) != 0) goto LAB_001be9f9;
      tVar3 = tVar3 - 1;
    } while (tVar3 != 0);
  }
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  SpanContext::SpanContext
            (__return_storage_ptr__,&local_78,local_80,local_88,'\0',(StrMap *)&local_68,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
LAB_001be9f4:
    operator_delete(local_f8._M_dataplus._M_p);
  }
LAB_001be9f9:
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  return __return_storage_ptr__;
}

Assistant:

SpanContext extract(std::istream& in) const override
    {
        const auto traceIDHigh = readBinary<uint64_t>(in);
        const auto traceIDLow = readBinary<uint64_t>(in);
        TraceID traceID(traceIDHigh, traceIDLow);
        const auto spanID = readBinary<uint64_t>(in);
        const auto parentID = readBinary<uint64_t>(in);

        auto ch = '\0';
        in.get(ch);
        const auto flags = static_cast<unsigned char>(ch);

        const auto numBaggageItems = readBinary<uint32_t>(in);
        StrMap baggage;
        baggage.reserve(numBaggageItems);
        for (auto i = static_cast<uint32_t>(0); i < numBaggageItems; ++i) {
            const auto keyLength = readBinary<uint32_t>(in);
            std::string key(keyLength, '\0');
            if (!in.read(&key[0], keyLength)) {
                _metrics->decodingErrors().inc(1);
                return SpanContext();
            }

            const auto valueLength = readBinary<uint32_t>(in);
            std::string value(valueLength, '\0');
            if (!in.read(&value[0], valueLength)) {
                _metrics->decodingErrors().inc(1);
                return SpanContext();
            }

            baggage[key] = value;
        }

        SpanContext ctx(traceID, spanID, parentID, flags, baggage);
        return ctx;
    }